

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O2

void __thiscall myvk::Buffer::UpdateData<unsigned_int>(Buffer *this,uint *data,uint32_t byte_offset)

{
  void *pvVar1;
  
  if (this->m_mapped_ptr != (void *)0x0) {
    *(uint *)((long)this->m_mapped_ptr + (ulong)byte_offset) = *data;
    return;
  }
  pvVar1 = Map(this);
  *(uint *)((long)pvVar1 + (ulong)byte_offset) = *data;
  Unmap(this);
  return;
}

Assistant:

inline void UpdateData(const T &data, uint32_t byte_offset = 0) const {
		if (m_mapped_ptr) {
			std::copy(&data, &data + 1, (T *)((uint8_t *)GetMappedData() + byte_offset));
		} else {
			std::copy(&data, &data + 1, (T *)((uint8_t *)Map() + byte_offset));
			Unmap();
		}
	}